

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeUpdateHasCentralNodeChild(ImGuiDockNode *node)

{
  ImGuiDockNode *pIVar1;
  
  node->field_0xbd = node->field_0xbd & 0xdf;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateHasCentralNodeChild(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateHasCentralNodeChild(node->ChildNodes[1]);
  }
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    for (pIVar1 = node->CentralNode; pIVar1 != (ImGuiDockNode *)0x0; pIVar1 = pIVar1->ParentNode) {
      pIVar1->field_0xbd = pIVar1->field_0xbd | 0x20;
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdateHasCentralNodeChild(ImGuiDockNode* node)
{
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateHasCentralNodeChild(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateHasCentralNodeChild(node->ChildNodes[1]);
    if (node->IsRootNode())
    {
        ImGuiDockNode* mark_node = node->CentralNode;
        while (mark_node)
        {
            mark_node->HasCentralNodeChild = true;
            mark_node = mark_node->ParentNode;
        }
    }
}